

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QColorListView.cpp
# Opt level: O2

void QColorListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayDataPointer<QString> *this;
  NameFormat NVar1;
  QArrayDataPointer<QString> QStack_28;
  
  if (_c == WriteProperty) {
    if (_id == 1) {
      setColorNames((QColorListView *)_o,(QStringList *)*_a);
      return;
    }
    if (_id == 0) {
      setNameFormat((QColorListView *)_o,*(NameFormat *)&(((QStringList *)*_a)->d).d);
      return;
    }
  }
  else if (_c == ReadProperty) {
    this = (QArrayDataPointer<QString> *)*_a;
    if (_id == 1) {
      colorNames((QStringList *)&QStack_28,(QColorListView *)_o);
      QArrayDataPointer<QString>::operator=(this,&QStack_28);
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_28);
    }
    else if (_id == 0) {
      NVar1 = nameFormat((QColorListView *)_o);
      *(NameFormat *)&this->d = NVar1;
    }
  }
  return;
}

Assistant:

void QColorListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QColorListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QColorListModel::NameFormat*>(_v) = _t->nameFormat(); break;
        case 1: *reinterpret_cast< QStringList*>(_v) = _t->colorNames(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QColorListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFormat(*reinterpret_cast< QColorListModel::NameFormat*>(_v)); break;
        case 1: _t->setColorNames(*reinterpret_cast< QStringList*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}